

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O2

void CreateBackwardReferencesDH6
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  ulong *puVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  int iVar7;
  undefined4 uVar8;
  size_t sVar9;
  size_t sVar10;
  BrotliEncoderDictionary *pBVar11;
  uint32_t *puVar12;
  uint32_t *puVar13;
  uint64_t uVar14;
  HasherCommon *pHVar15;
  size_t sVar16;
  size_t sVar17;
  PreparedDictionary *pPVar18;
  uint8_t *puVar19;
  BrotliDictionary *pBVar20;
  size_t sVar21;
  undefined8 uVar22;
  int iVar23;
  byte bVar24;
  ulong uVar25;
  ulong uVar26;
  size_t sVar27;
  ulong uVar28;
  ulong uVar29;
  byte bVar30;
  ulong uVar31;
  ulong *puVar32;
  char *pcVar33;
  ulong uVar34;
  uint32_t uVar35;
  uint uVar36;
  int iVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  uint *puVar42;
  int iVar43;
  ulong uVar44;
  ulong uVar45;
  ulong *puVar46;
  ulong uVar47;
  byte bVar48;
  uint16_t uVar49;
  uint uVar50;
  ulong uVar51;
  ulong uVar52;
  undefined8 *puVar53;
  uint uVar54;
  int iVar55;
  uint uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  size_t sVar61;
  long lVar62;
  ulong uVar63;
  ulong uVar64;
  uint8_t *s1_orig_2;
  ulong uVar65;
  ulong uVar66;
  int last_distance;
  ulong uVar67;
  long lVar68;
  ulong uVar69;
  bool bVar70;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d0;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1a8;
  size_t local_198;
  ulong local_188;
  ulong local_178;
  ulong local_158;
  uint local_12c;
  Command *local_128;
  ulong local_120;
  ulong local_f0;
  
  iVar37 = params->lgwin;
  uVar4 = (position - 7) + num_bytes;
  sVar61 = position;
  if (7 < num_bytes) {
    sVar61 = uVar4;
  }
  lVar62 = 0x200;
  if (params->quality < 9) {
    lVar62 = 0x40;
  }
  sVar9 = params->stream_offset;
  local_198 = *last_insert_len;
  uVar1 = position + num_bytes;
  sVar10 = (params->dictionary).compound.total_size;
  uVar50 = (uint)(hasher->privat)._H35.hb.next_ix;
  if (4 < (int)uVar50) {
    iVar7 = *dist_cache;
    dist_cache[4] = iVar7 + -1;
    dist_cache[5] = iVar7 + 1;
    dist_cache[6] = iVar7 + -2;
    dist_cache[7] = iVar7 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar7 + 3,iVar7 + -3);
    if (10 < uVar50) {
      iVar7 = dist_cache[1];
      dist_cache[10] = iVar7 + -1;
      dist_cache[0xb] = iVar7 + 1;
      dist_cache[0xc] = iVar7 + -2;
      dist_cache[0xd] = iVar7 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar7 + 3,iVar7 + -3);
    }
  }
  uVar5 = (1L << ((byte)iVar37 & 0x3f)) - 0x10;
  uVar66 = lVar62 + position;
  lVar38 = sVar10 + 1;
  lVar3 = position - 1;
  local_128 = commands;
LAB_01e2b56a:
LAB_01e2b578:
  uVar28 = position;
  if (uVar1 <= uVar28 + 8) {
    *last_insert_len = (local_198 + uVar1) - uVar28;
    *num_commands = *num_commands + ((long)local_128 - (long)commands >> 4);
    return;
  }
  uVar57 = uVar5;
  if (uVar28 < uVar5) {
    uVar57 = uVar28;
  }
  uVar29 = sVar9 + uVar28;
  if (uVar5 <= sVar9 + uVar28) {
    uVar29 = uVar5;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_12c = 0;
    local_f0 = 0;
    goto LAB_01e2b61a;
  }
  if (uVar28 == 0) {
    local_f0 = 0;
LAB_01e2b5ea:
    uVar25 = 0;
  }
  else {
    local_f0 = (ulong)ringbuffer[uVar28 - 1 & ringbuffer_mask];
    if (uVar28 == 1) goto LAB_01e2b5ea;
    uVar25 = (ulong)ringbuffer[uVar28 - 2 & ringbuffer_mask];
  }
  local_12c = (uint)(params->dictionary).contextual.context_map
                    [literal_context_lut[uVar25 + 0x100] | literal_context_lut[local_f0]];
LAB_01e2b61a:
  uVar39 = uVar1 - uVar28;
  pBVar11 = (params->dictionary).contextual.dict[local_12c];
  uVar25 = (params->dist).max_distance;
  puVar12 = (hasher->privat)._H5.buckets_;
  puVar13 = (hasher->privat)._H6.buckets_;
  uVar51 = uVar28 & ringbuffer_mask;
  puVar2 = (ulong *)(ringbuffer + uVar51);
  uVar58 = 0x7e4;
  uVar26 = 0;
  uVar40 = 0;
  uVar44 = 0;
  uVar65 = 0;
  do {
    if (uVar44 == (long)(hasher->privat)._H6.num_last_distances_to_check_) {
      uVar44 = (hasher->privat)._H5.block_size_;
      uVar14 = (hasher->privat)._H6.hash_mul_;
      uVar31 = *puVar2 * uVar14 >> 0x31;
      lVar68 = uVar31 << (*(byte *)((long)&hasher->privat + 0x1c) & 0x3f);
      uVar6 = *(ushort *)((long)puVar12 + uVar31 * 2);
      uVar67 = (ulong)uVar6;
      uVar52 = 0;
      if (uVar44 <= uVar67) {
        uVar52 = uVar67 - uVar44;
      }
      uVar50 = (hasher->privat)._H6.block_mask_;
      do {
        uVar59 = uVar65;
        local_188 = uVar58;
        uVar47 = uVar40;
        local_1b8 = uVar26;
        uVar63 = uVar59 + uVar51;
        do {
          do {
            do {
              if (uVar67 <= uVar52) {
LAB_01e2b94b:
                puVar13[lVar68 + (ulong)(uVar50 & uVar6)] = (uint32_t)uVar28;
                *(ushort *)((long)puVar12 + uVar31 * 2) = uVar6 + 1;
                if (local_188 != 0x7e4) {
                  iVar37 = 0;
                  goto LAB_01e2b9ca;
                }
                pHVar15 = (hasher->privat)._H6.common_;
                uVar57 = pHVar15->dict_num_lookups;
                local_1a8 = pHVar15->dict_num_matches;
                local_188 = 0x7e4;
                if (uVar57 >> 7 <= local_1a8) {
                  uVar26 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                  puVar19 = pBVar11->hash_table_lengths;
                  iVar37 = 0;
                  lVar68 = 0;
                  goto LAB_01e2be67;
                }
                iVar37 = 0;
                goto LAB_01e2b9ca;
              }
              uVar67 = uVar67 - 1;
              uVar26 = uVar28 - puVar13[lVar68 + (ulong)((uint)uVar67 & uVar50)];
              if (uVar57 < uVar26) goto LAB_01e2b94b;
            } while (ringbuffer_mask < uVar63);
            uVar58 = (ulong)(puVar13[lVar68 + (ulong)((uint)uVar67 & uVar50)] &
                            (uint)ringbuffer_mask);
            uVar40 = uVar59 + uVar58;
          } while (((ringbuffer_mask < uVar40) || (ringbuffer[uVar63] != ringbuffer[uVar40])) ||
                  (*(int *)(ringbuffer + uVar58) != (int)*puVar2));
          lVar41 = 0;
          uVar40 = uVar39 - 4;
LAB_01e2b8d2:
          if (uVar40 < 8) {
            for (; ((uVar28 - uVar1) + lVar41 != -4 &&
                   (ringbuffer[lVar41 + uVar58 + 4] == *(uint8_t *)((long)puVar2 + lVar41 + 4)));
                lVar41 = lVar41 + 1) {
            }
          }
          else {
            uVar65 = *(ulong *)((long)puVar2 + lVar41 + 4);
            if (uVar65 == *(ulong *)(ringbuffer + lVar41 + uVar58 + 4)) goto code_r0x01e2b8e5;
            uVar65 = *(ulong *)(ringbuffer + lVar41 + uVar58 + 4) ^ uVar65;
            uVar40 = 0;
            if (uVar65 != 0) {
              for (; (uVar65 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
              }
            }
            lVar41 = lVar41 + (uVar40 >> 3 & 0x1fffffff);
          }
          uVar40 = lVar41 + 4;
          iVar37 = 0x1f;
          if ((uint)uVar26 != 0) {
            for (; (uint)uVar26 >> iVar37 == 0; iVar37 = iVar37 + -1) {
            }
          }
          uVar58 = (ulong)(iVar37 * -0x1e + 0x780) + uVar40 * 0x87;
          uVar65 = uVar40;
        } while (uVar58 <= local_188);
      } while( true );
    }
    uVar52 = (ulong)dist_cache[uVar44];
    if (((uVar52 <= uVar57) && (uVar28 - uVar52 < uVar28)) && (uVar51 + uVar65 <= ringbuffer_mask))
    {
      uVar31 = uVar28 - uVar52 & ringbuffer_mask;
      uVar67 = uVar31 + uVar65;
      if ((uVar67 <= ringbuffer_mask) && (ringbuffer[uVar51 + uVar65] == ringbuffer[uVar67])) {
        puVar32 = (ulong *)(ringbuffer + uVar31);
        lVar68 = 0;
        puVar46 = puVar2;
        uVar67 = uVar39;
LAB_01e2b6e9:
        if (uVar67 < 8) {
          for (uVar31 = 0;
              (uVar67 != uVar31 &&
              (*(char *)((long)puVar32 + uVar31) == *(char *)((long)puVar46 + uVar31)));
              uVar31 = uVar31 + 1) {
          }
        }
        else {
          if (*puVar46 == *puVar32) goto code_r0x01e2b6fb;
          uVar31 = *puVar32 ^ *puVar46;
          uVar67 = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> uVar67 & 1) == 0; uVar67 = uVar67 + 1) {
            }
          }
          uVar31 = uVar67 >> 3 & 0x1fffffff;
        }
        uVar31 = uVar31 - lVar68;
        if (((2 < uVar31) || ((uVar44 < 2 && (uVar31 == 2)))) &&
           (uVar67 = uVar31 * 0x87 + 0x78f, uVar58 < uVar67)) {
          if (uVar44 != 0) {
            uVar67 = uVar67 - ((0x1ca10U >> ((byte)uVar44 & 0xe) & 0xe) + 0x27);
          }
          if (uVar58 < uVar67) {
            uVar26 = uVar52;
            uVar40 = uVar31;
            uVar58 = uVar67;
            uVar65 = uVar31;
          }
        }
      }
    }
    uVar44 = uVar44 + 1;
  } while( true );
LAB_01e2be67:
  if (lVar68 == 2) goto LAB_01e2b9ca;
  uVar57 = uVar57 + 1;
  pHVar15->dict_num_lookups = uVar57;
  bVar30 = puVar19[uVar26];
  uVar40 = (ulong)bVar30;
  if ((uVar40 != 0) && (uVar40 <= uVar39)) {
    pBVar20 = pBVar11->words;
    puVar32 = (ulong *)(pBVar20->data +
                       (ulong)pBVar20->offsets_by_length[uVar40] +
                       pBVar11->hash_table_words[uVar26] * uVar40);
    lVar41 = 0;
    puVar46 = puVar2;
    uVar58 = uVar40;
LAB_01e2beca:
    if (uVar58 < 8) {
      for (uVar58 = 0;
          ((bVar30 & 7) != uVar58 &&
          (*(char *)((long)puVar46 + uVar58) == *(char *)((long)puVar32 + uVar58)));
          uVar58 = uVar58 + 1) {
      }
      uVar58 = uVar58 - lVar41;
    }
    else {
      if (*puVar32 == *puVar46) goto code_r0x01e2bedb;
      uVar65 = *puVar46 ^ *puVar32;
      uVar58 = 0;
      if (uVar65 != 0) {
        for (; (uVar65 >> uVar58 & 1) == 0; uVar58 = uVar58 + 1) {
        }
      }
      uVar58 = (uVar58 >> 3 & 0x1fffffff) - lVar41;
    }
    if (((uVar58 != 0) && (uVar40 < pBVar11->cutoffTransformsCount + uVar58)) &&
       (uVar40 = (ulong)pBVar11->hash_table_words[uVar26] + uVar29 + lVar38 +
                 ((ulong)((uint)(pBVar11->cutoffTransforms >>
                                ((char)(uVar40 - uVar58) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar40 - uVar58) * 4 << (pBVar20->size_bits_by_length[uVar40] & 0x3f)),
       uVar40 <= uVar25)) {
      iVar7 = 0x1f;
      if ((uint)uVar40 != 0) {
        for (; (uint)uVar40 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      uVar65 = (uVar58 * 0x87 - (ulong)(uint)(iVar7 * 0x1e)) + 0x780;
      if (local_188 <= uVar65) {
        iVar37 = (uint)bVar30 - (int)uVar58;
        local_1a8 = local_1a8 + 1;
        pHVar15->dict_num_matches = local_1a8;
        local_1b8 = uVar40;
        local_188 = uVar65;
        uVar47 = uVar58;
      }
    }
  }
  lVar68 = lVar68 + 1;
  uVar26 = uVar26 + 1;
  goto LAB_01e2be67;
LAB_01e2b9ca:
  sVar16 = (params->dictionary).compound.num_chunks;
  sVar17 = (params->dictionary).compound.total_size;
  sVar27 = 0;
LAB_01e2b9eb:
  if (sVar27 != sVar16) {
    pPVar18 = (params->dictionary).compound.chunks[sVar27];
    bVar30 = (byte)pPVar18->bucket_bits;
    bVar48 = (byte)pPVar18->slot_bits;
    bVar24 = -(char)pPVar18->hash_bits;
    uVar57 = ((*puVar2 << (bVar24 & 0x3f)) >> (bVar24 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar30 & 0x3f);
    lVar68 = (1L << (bVar48 & 0x3f)) * 4;
    lVar41 = (1L << (bVar30 & 0x3f)) * 2;
    bVar48 = -bVar48;
    uVar50 = (uint)*(ushort *)((long)&pPVar18[1].magic + (uVar57 & 0xffffffff) * 2 + lVar68);
    puVar53 = (undefined8 *)
              ((long)&pPVar18[1].magic + (ulong)pPVar18->num_items * 4 + lVar41 + lVar68);
    if (pPVar18->magic != 0xdebcede0) {
      puVar53 = (undefined8 *)*puVar53;
    }
    uVar40 = (uVar29 + sVar17) - (params->dictionary).compound.chunk_offsets[sVar27];
    uVar26 = (ulong)pPVar18->source_size;
    puVar42 = (uint *)((long)&pPVar18[1].magic +
                      (ulong)(uVar50 + (&pPVar18[1].magic)
                                       [(uint)((int)uVar57 << (bVar48 & 0x1f)) >> (bVar48 & 0x1f)])
                      * 4 + lVar41 + lVar68);
    uVar50 = (uint)(uVar50 == 0xffff);
    lVar68 = 0;
    local_1c0 = uVar47;
    local_1a8 = local_188;
    do {
      if (lVar68 == 4) {
        do {
          do {
            do {
              do {
                if (uVar50 != 0) {
                  sVar27 = sVar27 + 1;
                  goto LAB_01e2b9eb;
                }
                uVar50 = *puVar42;
                puVar42 = puVar42 + 1;
                uVar58 = (ulong)(uVar50 & 0x7fffffff);
                uVar50 = uVar50 & 0x80000000;
                uVar65 = uVar40 - uVar58;
                uVar57 = uVar26 - uVar58;
                if (uVar39 <= uVar26 - uVar58) {
                  uVar57 = uVar39;
                }
              } while ((((uVar25 < uVar65) || (ringbuffer_mask < uVar51 + local_1c0)) ||
                       (uVar57 <= local_1c0)) ||
                      (ringbuffer[uVar51 + local_1c0] !=
                       *(uint8_t *)((long)puVar53 + local_1c0 + uVar58)));
              lVar68 = (long)puVar53 + uVar58;
              uVar67 = 0;
              lVar41 = 0;
              puVar46 = puVar2;
              uVar52 = uVar57;
LAB_01e2bc90:
              if (7 < uVar52) {
                if (*puVar46 == *(ulong *)(lVar68 + uVar67)) goto code_r0x01e2bca3;
                uVar58 = *(ulong *)(lVar68 + uVar67) ^ *puVar46;
                uVar57 = 0;
                if (uVar58 != 0) {
                  for (; (uVar58 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                  }
                }
                uVar57 = (uVar57 >> 3 & 0x1fffffff) - lVar41;
                goto LAB_01e2bcfd;
              }
              lVar41 = uVar58 + uVar57 + (long)puVar53;
              for (; uVar57 != uVar67; uVar67 = uVar67 + 1) {
                if (*(char *)(lVar68 + uVar67) != *(char *)((long)puVar2 + uVar67)) {
                  lVar41 = uVar67 + lVar68;
                  break;
                }
              }
              uVar57 = lVar41 - lVar68;
LAB_01e2bcfd:
            } while (uVar57 < 4);
            iVar7 = 0x1f;
            if ((uint)uVar65 != 0) {
              for (; (uint)uVar65 >> iVar7 == 0; iVar7 = iVar7 + -1) {
              }
            }
            uVar58 = (ulong)(iVar7 * -0x1e + 0x780) + uVar57 * 0x87;
          } while (uVar58 <= local_1a8);
          iVar37 = 0;
          uVar47 = uVar57;
          local_1c0 = uVar57;
          local_1b8 = uVar65;
          local_1a8 = uVar58;
          local_188 = uVar58;
        } while( true );
      }
      uVar57 = (ulong)dist_cache[lVar68];
      if ((uVar40 - uVar26 < uVar57) && (lVar41 = uVar40 - uVar57, uVar57 <= uVar40)) {
        uVar58 = uVar26 - lVar41;
        if (uVar39 <= uVar26 - lVar41) {
          uVar58 = uVar39;
        }
        uVar52 = 0;
        uVar65 = uVar58;
LAB_01e2bb1a:
        if (uVar65 < 8) {
          for (pcVar33 = (char *)((long)puVar53 + uVar52 + lVar41);
              (uVar58 != uVar52 && (*pcVar33 == *(char *)((long)puVar2 + uVar52)));
              pcVar33 = pcVar33 + 1) {
            uVar52 = uVar52 + 1;
          }
        }
        else {
          uVar67 = *(ulong *)((long)puVar53 + uVar52 + lVar41);
          if (*(ulong *)((long)puVar2 + uVar52) == uVar67) goto code_r0x01e2bb2d;
          uVar67 = uVar67 ^ *(ulong *)((long)puVar2 + uVar52);
          uVar58 = 0;
          if (uVar67 != 0) {
            for (; (uVar67 >> uVar58 & 1) == 0; uVar58 = uVar58 + 1) {
            }
          }
          uVar52 = uVar52 + (uVar58 >> 3 & 0x1fffffff);
        }
        if ((1 < uVar52) && (uVar58 = uVar52 * 0x87 + 0x78f, local_1a8 < uVar58)) {
          if (lVar68 != 0) {
            uVar58 = uVar58 - ((0x1ca10U >> ((byte)lVar68 & 2) & 4) + 0x27);
          }
          if (local_1a8 < uVar58) {
            if (local_1c0 < uVar52) {
              local_1c0 = uVar52;
            }
            iVar37 = 0;
            uVar47 = uVar52;
            local_188 = uVar58;
            local_1b8 = uVar57;
            local_1a8 = uVar58;
          }
        }
      }
      lVar68 = lVar68 + 1;
    } while( true );
  }
  if (local_188 < 0x7e5) {
    local_198 = local_198 + 1;
    position = uVar28 + 1;
    if (uVar66 < position) {
      if (uVar66 + (uint)((int)lVar62 * 4) < position) {
        uVar57 = uVar28 + 0x11;
        if (uVar4 <= uVar28 + 0x11) {
          uVar57 = uVar4;
        }
        for (; position < uVar57; position = position + 4) {
          uVar28 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar14 >> 0x31;
          uVar6 = *(ushort *)((long)puVar12 + uVar28 * 2);
          uVar50 = (hasher->privat)._H6.block_mask_;
          bVar30 = *(byte *)((long)&hasher->privat + 0x1c);
          *(ushort *)((long)puVar12 + uVar28 * 2) = uVar6 + 1;
          puVar13[(uVar28 << (bVar30 & 0x3f)) + (ulong)(uVar50 & uVar6)] = (uint32_t)position;
          local_198 = local_198 + 4;
        }
      }
      else {
        uVar57 = uVar28 + 9;
        if (uVar4 <= uVar28 + 9) {
          uVar57 = uVar4;
        }
        for (; position < uVar57; position = position + 2) {
          uVar28 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar14 >> 0x31;
          uVar6 = *(ushort *)((long)puVar12 + uVar28 * 2);
          uVar50 = (hasher->privat)._H6.block_mask_;
          bVar30 = *(byte *)((long)&hasher->privat + 0x1c);
          *(ushort *)((long)puVar12 + uVar28 * 2) = uVar6 + 1;
          puVar13[(uVar28 << (bVar30 & 0x3f)) + (ulong)(uVar50 & uVar6)] = (uint32_t)position;
          local_198 = local_198 + 2;
        }
      }
    }
    goto LAB_01e2b578;
  }
  iVar7 = (hasher->privat)._H6.num_last_distances_to_check_;
  uVar50 = (hasher->privat)._H6.block_mask_;
  uVar8 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
  uVar57 = local_198 + 4;
  uVar66 = sVar9 + 1 + uVar28;
  local_158 = (lVar3 + num_bytes) - uVar28;
  iVar55 = 0;
LAB_01e2c104:
  uVar29 = uVar5;
  if (uVar66 < uVar5) {
    uVar29 = uVar66;
  }
  uVar40 = uVar39 - 1;
  uVar26 = uVar47 - 1;
  if (uVar40 <= uVar47 - 1) {
    uVar26 = uVar40;
  }
  if (4 < params->quality) {
    uVar26 = 0;
  }
  uVar58 = uVar28 + 1;
  uVar65 = uVar5;
  if (uVar58 < uVar5) {
    uVar65 = uVar58;
  }
  local_120 = sVar9 + uVar28 + 1;
  if (uVar5 <= local_120) {
    local_120 = uVar5;
  }
  if ((params->dictionary).contextual.context_based != 0) {
    local_12c = (uint)(params->dictionary).contextual.context_map
                      [literal_context_lut[local_f0 + 0x100] |
                       literal_context_lut[ringbuffer[uVar28 & ringbuffer_mask]]];
    local_f0 = (ulong)ringbuffer[uVar28 & ringbuffer_mask];
  }
  pBVar11 = (params->dictionary).contextual.dict[local_12c];
  uVar63 = uVar58 & ringbuffer_mask;
  puVar2 = (ulong *)(ringbuffer + uVar63);
  uVar67 = 0x7e4;
  uVar51 = 0;
  uVar52 = 0;
  uVar31 = 0;
  do {
    if (uVar31 == (long)iVar7) {
      uVar69 = *puVar2 * uVar14 >> 0x31;
      lVar68 = uVar69 << ((byte)uVar8 & 0x3f);
      uVar6 = *(ushort *)((long)puVar12 + uVar69 * 2);
      uVar59 = (ulong)uVar6;
      uVar31 = 0;
      if (uVar44 <= uVar59) {
        uVar31 = uVar59 - uVar44;
      }
      do {
        uVar64 = uVar26;
        local_1d0 = uVar67;
        uVar45 = uVar52;
        uVar60 = uVar51;
        uVar34 = uVar64 + uVar63;
        do {
          do {
            do {
              if (uVar59 <= uVar31) {
LAB_01e2c4aa:
                puVar13[lVar68 + (ulong)(uVar50 & uVar6)] = (uint32_t)uVar58;
                *(ushort *)((long)puVar12 + uVar69 * 2) = uVar6 + 1;
                iVar43 = 0;
                if (local_1d0 != 0x7e4) goto LAB_01e2c708;
                pHVar15 = (hasher->privat)._H6.common_;
                uVar26 = pHVar15->dict_num_lookups;
                local_178 = pHVar15->dict_num_matches;
                local_1d0 = 0x7e4;
                if (local_178 < uVar26 >> 7) goto LAB_01e2c708;
                uVar39 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                puVar19 = pBVar11->hash_table_lengths;
                local_1d0 = 0x7e4;
                iVar43 = 0;
                lVar68 = 0;
                goto LAB_01e2c574;
              }
              uVar59 = uVar59 - 1;
              uVar51 = uVar58 - puVar13[lVar68 + (ulong)((hasher->privat)._H6.block_mask_ &
                                                        (uint)uVar59)];
              if (uVar65 < uVar51) goto LAB_01e2c4aa;
            } while (ringbuffer_mask < uVar34);
            uVar52 = (ulong)(puVar13[lVar68 + (ulong)((hasher->privat)._H6.block_mask_ &
                                                     (uint)uVar59)] & (uint)ringbuffer_mask);
            uVar26 = uVar52 + uVar64;
          } while (((ringbuffer_mask < uVar26) || (ringbuffer[uVar34] != ringbuffer[uVar26])) ||
                  (*(int *)(ringbuffer + uVar52) != (int)*puVar2));
          lVar41 = 0;
          uVar26 = uVar39 - 5;
LAB_01e2c43a:
          if (uVar26 < 8) {
            for (; (bVar70 = uVar26 != 0, uVar26 = uVar26 - 1, bVar70 &&
                   (ringbuffer[lVar41 + uVar52 + 4] == *(uint8_t *)((long)puVar2 + lVar41 + 4)));
                lVar41 = lVar41 + 1) {
            }
          }
          else {
            uVar67 = *(ulong *)((long)puVar2 + lVar41 + 4);
            if (uVar67 == *(ulong *)(ringbuffer + lVar41 + uVar52 + 4)) goto code_r0x01e2c44e;
            uVar67 = *(ulong *)(ringbuffer + lVar41 + uVar52 + 4) ^ uVar67;
            uVar26 = 0;
            if (uVar67 != 0) {
              for (; (uVar67 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            lVar41 = lVar41 + (uVar26 >> 3 & 0x1fffffff);
          }
          uVar52 = lVar41 + 4;
          iVar43 = 0x1f;
          if ((uint)uVar51 != 0) {
            for (; (uint)uVar51 >> iVar43 == 0; iVar43 = iVar43 + -1) {
            }
          }
          uVar67 = (ulong)(iVar43 * -0x1e + 0x780) + uVar52 * 0x87;
          uVar26 = uVar52;
        } while (uVar67 <= local_1d0);
      } while( true );
    }
    uVar59 = (ulong)dist_cache[uVar31];
    if (((uVar59 <= uVar65) && (uVar58 - uVar59 < uVar58)) && (uVar63 + uVar26 <= ringbuffer_mask))
    {
      uVar34 = uVar58 - uVar59 & ringbuffer_mask;
      uVar69 = uVar34 + uVar26;
      if ((uVar69 <= ringbuffer_mask) && (ringbuffer[uVar63 + uVar26] == ringbuffer[uVar69])) {
        puVar32 = (ulong *)(ringbuffer + uVar34);
        lVar68 = 0;
        puVar46 = puVar2;
        uVar69 = uVar40;
LAB_01e2c26d:
        if (uVar69 < 8) {
          for (uVar34 = 0;
              (uVar69 != uVar34 &&
              (*(char *)((long)puVar32 + uVar34) == *(char *)((long)puVar46 + uVar34)));
              uVar34 = uVar34 + 1) {
          }
        }
        else {
          if (*puVar46 == *puVar32) goto code_r0x01e2c27f;
          uVar34 = *puVar32 ^ *puVar46;
          uVar69 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> uVar69 & 1) == 0; uVar69 = uVar69 + 1) {
            }
          }
          uVar34 = uVar69 >> 3 & 0x1fffffff;
        }
        uVar34 = uVar34 - lVar68;
        if (((2 < uVar34) || ((uVar31 < 2 && (uVar34 == 2)))) &&
           (uVar69 = uVar34 * 0x87 + 0x78f, uVar67 < uVar69)) {
          if (uVar31 != 0) {
            uVar69 = uVar69 - ((0x1ca10U >> ((byte)uVar31 & 0xe) & 0xe) + 0x27);
          }
          if (uVar67 < uVar69) {
            uVar51 = uVar59;
            uVar52 = uVar34;
            uVar67 = uVar69;
            uVar26 = uVar34;
          }
        }
      }
    }
    uVar31 = uVar31 + 1;
  } while( true );
code_r0x01e2bca3:
  puVar46 = puVar46 + 1;
  uVar52 = uVar52 - 8;
  lVar41 = lVar41 + -8;
  uVar67 = uVar67 + 8;
  goto LAB_01e2bc90;
code_r0x01e2bb2d:
  uVar65 = uVar65 - 8;
  uVar52 = uVar52 + 8;
  goto LAB_01e2bb1a;
LAB_01e2c574:
  if (lVar68 == 2) goto LAB_01e2c708;
  uVar26 = uVar26 + 1;
  pHVar15->dict_num_lookups = uVar26;
  bVar30 = puVar19[uVar39];
  uVar65 = (ulong)bVar30;
  if ((uVar65 != 0) && (uVar65 <= uVar40)) {
    pBVar20 = pBVar11->words;
    puVar32 = (ulong *)(pBVar20->data +
                       (ulong)pBVar20->offsets_by_length[uVar65] +
                       pBVar11->hash_table_words[uVar39] * uVar65);
    lVar41 = 0;
    puVar46 = puVar2;
    uVar51 = uVar65;
LAB_01e2c5da:
    if (uVar51 < 8) {
      for (uVar51 = 0;
          ((bVar30 & 7) != uVar51 &&
          (*(char *)((long)puVar46 + uVar51) == *(char *)((long)puVar32 + uVar51)));
          uVar51 = uVar51 + 1) {
      }
    }
    else {
      if (*puVar32 == *puVar46) goto code_r0x01e2c5eb;
      uVar52 = *puVar46 ^ *puVar32;
      uVar51 = 0;
      if (uVar52 != 0) {
        for (; (uVar52 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
        }
      }
      uVar51 = uVar51 >> 3 & 0x1fffffff;
    }
    uVar51 = uVar51 - lVar41;
    if (((uVar51 != 0) && (uVar65 < pBVar11->cutoffTransformsCount + uVar51)) &&
       (uVar65 = (ulong)pBVar11->hash_table_words[uVar39] + lVar38 + local_120 +
                 ((ulong)((uint)(pBVar11->cutoffTransforms >>
                                ((char)(uVar65 - uVar51) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar65 - uVar51) * 4 << (pBVar20->size_bits_by_length[uVar65] & 0x3f)),
       uVar65 <= uVar25)) {
      iVar23 = 0x1f;
      if ((uint)uVar65 != 0) {
        for (; (uint)uVar65 >> iVar23 == 0; iVar23 = iVar23 + -1) {
        }
      }
      uVar52 = (uVar51 * 0x87 - (ulong)(uint)(iVar23 * 0x1e)) + 0x780;
      if (local_1d0 <= uVar52) {
        iVar43 = (uint)bVar30 - (int)uVar51;
        local_178 = local_178 + 1;
        pHVar15->dict_num_matches = local_178;
        local_1d0 = uVar52;
        uVar60 = uVar65;
        uVar45 = uVar51;
      }
    }
  }
  lVar68 = lVar68 + 1;
  uVar39 = uVar39 + 1;
  goto LAB_01e2c574;
LAB_01e2c708:
  sVar27 = 0;
LAB_01e2c74e:
  if (sVar27 != sVar16) {
    pPVar18 = (params->dictionary).compound.chunks[sVar27];
    bVar30 = (byte)pPVar18->bucket_bits;
    bVar48 = (byte)pPVar18->slot_bits;
    bVar24 = -(char)pPVar18->hash_bits;
    uVar26 = ((*puVar2 << (bVar24 & 0x3f)) >> (bVar24 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar30 & 0x3f);
    lVar68 = (1L << (bVar48 & 0x3f)) * 4;
    lVar41 = (1L << (bVar30 & 0x3f)) * 2;
    bVar48 = -bVar48;
    uVar54 = (uint)*(ushort *)((long)&pPVar18[1].magic + (uVar26 & 0xffffffff) * 2 + lVar68);
    puVar53 = (undefined8 *)
              ((long)&pPVar18[1].magic + (ulong)pPVar18->num_items * 4 + lVar41 + lVar68);
    if (pPVar18->magic != 0xdebcede0) {
      puVar53 = (undefined8 *)*puVar53;
    }
    sVar21 = (params->dictionary).compound.chunk_offsets[sVar27];
    uVar65 = (local_120 + sVar17) - sVar21;
    uVar39 = (ulong)pPVar18->source_size;
    puVar42 = (uint *)((long)&pPVar18[1].magic +
                      (ulong)(uVar54 + (&pPVar18[1].magic)
                                       [(uint)((int)uVar26 << (bVar48 & 0x1f)) >> (bVar48 & 0x1f)])
                      * 4 + lVar41 + lVar68);
    uVar54 = (uint)(uVar54 == 0xffff);
    lVar68 = 0;
    local_1e8 = local_1d0;
    local_1e0 = uVar45;
    do {
      if (lVar68 == 4) {
        do {
          do {
            do {
              do {
                if (uVar54 != 0) {
                  sVar27 = sVar27 + 1;
                  goto LAB_01e2c74e;
                }
                uVar54 = *puVar42;
                puVar42 = puVar42 + 1;
                uVar52 = (ulong)(uVar54 & 0x7fffffff);
                uVar54 = uVar54 & 0x80000000;
                uVar51 = uVar65 - uVar52;
                uVar26 = uVar39 - uVar52;
                if (uVar40 <= uVar39 - uVar52) {
                  uVar26 = uVar40;
                }
              } while ((((uVar25 < uVar51) || (ringbuffer_mask < uVar63 + local_1e0)) ||
                       (uVar26 <= local_1e0)) ||
                      (ringbuffer[uVar63 + local_1e0] !=
                       *(uint8_t *)((long)puVar53 + local_1e0 + uVar52)));
              puVar32 = (ulong *)(uVar52 + (long)puVar53);
              lVar68 = 0;
              puVar46 = puVar2;
LAB_01e2ca14:
              if (uVar26 < 8) {
                for (uVar52 = 0;
                    (uVar26 != uVar52 &&
                    (*(char *)((long)puVar32 + uVar52) == *(char *)((long)puVar46 + uVar52)));
                    uVar52 = uVar52 + 1) {
                }
              }
              else {
                if (*puVar46 == *puVar32) goto code_r0x01e2ca26;
                uVar52 = *puVar32 ^ *puVar46;
                uVar26 = 0;
                if (uVar52 != 0) {
                  for (; (uVar52 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                  }
                }
                uVar52 = uVar26 >> 3 & 0x1fffffff;
              }
              uVar52 = uVar52 - lVar68;
            } while (uVar52 < 4);
            iVar23 = 0x1f;
            if ((uint)uVar51 != 0) {
              for (; (uint)uVar51 >> iVar23 == 0; iVar23 = iVar23 + -1) {
              }
            }
            uVar26 = (ulong)(iVar23 * -0x1e + 0x780) + uVar52 * 0x87;
          } while (uVar26 <= local_1e8);
          iVar43 = 0;
          uVar60 = uVar51;
          uVar45 = uVar52;
          local_1e8 = uVar26;
          local_1e0 = uVar52;
          local_1d0 = uVar26;
        } while( true );
      }
      uVar26 = (ulong)dist_cache[lVar68];
      if ((uVar65 - uVar39 < uVar26) && (uVar26 <= uVar65)) {
        uVar51 = (uVar26 - uVar65) + uVar39;
        if (uVar40 <= uVar51) {
          uVar51 = uVar40;
        }
        lVar41 = ((uVar29 + sVar17) - sVar21) - uVar26;
        uVar52 = 0;
LAB_01e2c8a5:
        if (uVar51 < 8) {
          pcVar33 = (char *)((long)puVar53 + uVar52 + lVar41);
          uVar51 = sVar21 + (-uVar29 - sVar17) + uVar39 + uVar26;
          if (local_158 < uVar51) {
            uVar51 = local_158;
          }
          for (; (uVar51 != uVar52 && (*pcVar33 == *(char *)((long)puVar2 + uVar52)));
              pcVar33 = pcVar33 + 1) {
            uVar52 = uVar52 + 1;
          }
        }
        else {
          uVar67 = *(ulong *)((long)puVar53 + uVar52 + lVar41);
          if (*(ulong *)((long)puVar2 + uVar52) == uVar67) goto code_r0x01e2c8b8;
          uVar67 = uVar67 ^ *(ulong *)((long)puVar2 + uVar52);
          uVar51 = 0;
          if (uVar67 != 0) {
            for (; (uVar67 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
            }
          }
          uVar52 = uVar52 + (uVar51 >> 3 & 0x1fffffff);
        }
        if ((1 < uVar52) && (uVar51 = uVar52 * 0x87 + 0x78f, local_1e8 < uVar51)) {
          if (lVar68 != 0) {
            uVar51 = uVar51 - ((0x1ca10U >> ((byte)lVar68 & 2) & 4) + 0x27);
          }
          if (local_1e8 < uVar51) {
            if (local_1e0 < uVar52) {
              local_1e0 = uVar52;
            }
            iVar43 = 0;
            local_1d0 = uVar51;
            uVar60 = uVar26;
            uVar45 = uVar52;
            local_1e8 = uVar51;
          }
        }
      }
      lVar68 = lVar68 + 1;
    } while( true );
  }
  if (local_1d0 < local_188 + 0xaf) {
    uVar45 = uVar47;
    uVar58 = uVar28;
    uVar60 = local_1b8;
    iVar43 = iVar37;
    sVar27 = local_198;
    local_120 = uVar28 + sVar9;
    if (uVar5 <= uVar28 + sVar9) {
      local_120 = uVar5;
    }
    goto LAB_01e2cbaa;
  }
  sVar27 = uVar57;
  if (iVar55 == 3) goto LAB_01e2cbaa;
  local_198 = local_198 + 1;
  iVar55 = iVar55 + 1;
  uVar29 = uVar28 + 9;
  uVar66 = uVar66 + 1;
  local_158 = local_158 - 1;
  uVar39 = uVar40;
  uVar28 = uVar58;
  local_188 = local_1d0;
  uVar47 = uVar45;
  local_1b8 = uVar60;
  sVar27 = local_198;
  iVar37 = iVar43;
  if (uVar1 <= uVar29) goto LAB_01e2cbaa;
  goto LAB_01e2c104;
code_r0x01e2ca26:
  puVar46 = puVar46 + 1;
  puVar32 = puVar32 + 1;
  uVar26 = uVar26 - 8;
  lVar68 = lVar68 + -8;
  goto LAB_01e2ca14;
code_r0x01e2c8b8:
  uVar51 = uVar51 - 8;
  uVar52 = uVar52 + 8;
  goto LAB_01e2c8a5;
LAB_01e2cbaa:
  local_198 = sVar27;
  local_120 = local_120 + sVar10;
  if (local_120 < uVar60) {
LAB_01e2cbc7:
    uVar66 = uVar60 + 0xf;
  }
  else {
    if (uVar60 == (long)*dist_cache) {
      uVar66 = 0;
      goto LAB_01e2cc4f;
    }
    uVar66 = 1;
    if (uVar60 != (long)dist_cache[1]) {
      uVar66 = (uVar60 + 3) - (long)*dist_cache;
      if (uVar66 < 7) {
        bVar30 = (byte)((int)uVar66 << 2);
        uVar50 = 0x9750468;
      }
      else {
        uVar66 = (uVar60 + 3) - (long)dist_cache[1];
        if (6 < uVar66) {
          uVar66 = 2;
          if ((uVar60 != (long)dist_cache[2]) && (uVar66 = 3, uVar60 != (long)dist_cache[3]))
          goto LAB_01e2cbc7;
          goto LAB_01e2cbcb;
        }
        bVar30 = (byte)((int)uVar66 << 2);
        uVar50 = 0xfdb1ace;
      }
      uVar66 = (ulong)(uVar50 >> (bVar30 & 0x1f) & 0xf);
    }
  }
LAB_01e2cbcb:
  if ((uVar60 <= local_120) && (uVar66 != 0)) {
    dist_cache[3] = dist_cache[2];
    uVar22 = *(undefined8 *)dist_cache;
    *(undefined8 *)(dist_cache + 1) = uVar22;
    iVar37 = (int)uVar60;
    *dist_cache = iVar37;
    uVar50 = (uint)(hasher->privat)._H35.hb.next_ix;
    if (4 < (int)uVar50) {
      dist_cache[4] = iVar37 + -1;
      dist_cache[5] = iVar37 + 1;
      dist_cache[6] = iVar37 + -2;
      dist_cache[7] = iVar37 + 2;
      dist_cache[8] = iVar37 + -3;
      dist_cache[9] = iVar37 + 3;
      if (10 < uVar50) {
        iVar37 = (int)uVar22;
        dist_cache[10] = iVar37 + -1;
        dist_cache[0xb] = iVar37 + 1;
        dist_cache[0xc] = iVar37 + -2;
        dist_cache[0xd] = iVar37 + 2;
        *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar37 + 3,iVar37 + -3);
      }
    }
  }
LAB_01e2cc4f:
  uVar50 = (uint)local_198;
  local_128->insert_len_ = uVar50;
  local_128->copy_len_ = iVar43 << 0x19 | (uint)uVar45;
  uVar57 = (ulong)(params->dist).num_direct_distance_codes;
  uVar28 = uVar57 + 0x10;
  uVar35 = 0;
  if (uVar28 <= uVar66) {
    uVar54 = (params->dist).distance_postfix_bits;
    bVar30 = (byte)uVar54;
    uVar57 = ((4L << (bVar30 & 0x3f)) + (uVar66 - uVar57)) - 0x10;
    uVar56 = 0x1f;
    uVar36 = (uint)uVar57;
    if (uVar36 != 0) {
      for (; uVar36 >> uVar56 == 0; uVar56 = uVar56 - 1) {
      }
    }
    uVar56 = (uVar56 ^ 0xffffffe0) + 0x1f;
    uVar29 = (ulong)((uVar57 >> ((ulong)uVar56 & 0x3f) & 1) != 0);
    lVar68 = (ulong)uVar56 - (ulong)uVar54;
    uVar66 = (~(-1 << (bVar30 & 0x1f)) & uVar36) + uVar28 +
             (uVar29 + lVar68 * 2 + 0xfffe << (bVar30 & 0x3f)) | lVar68 * 0x400;
    uVar35 = (uint32_t)(uVar57 - (uVar29 + 2 << ((byte)uVar56 & 0x3f)) >> (bVar30 & 0x3f));
  }
  local_128->dist_prefix_ = (uint16_t)uVar66;
  local_128->dist_extra_ = uVar35;
  if (5 < local_198) {
    if (local_198 < 0x82) {
      uVar50 = 0x1f;
      uVar54 = (uint)(local_198 - 2);
      if (uVar54 != 0) {
        for (; uVar54 >> uVar50 == 0; uVar50 = uVar50 - 1) {
        }
      }
      uVar50 = (int)(local_198 - 2 >> ((char)(uVar50 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar50 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_198 < 0x842) {
      uVar54 = 0x1f;
      if (uVar50 - 0x42 != 0) {
        for (; uVar50 - 0x42 >> uVar54 == 0; uVar54 = uVar54 - 1) {
        }
      }
      uVar50 = (uVar54 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar50 = 0x15;
      if (0x1841 < local_198) {
        uVar50 = (uint)(ushort)(0x17 - (local_198 < 0x5842));
      }
    }
  }
  uVar54 = iVar43 + (uint)uVar45;
  if (uVar54 < 10) {
    uVar56 = uVar54 - 2;
  }
  else if (uVar54 < 0x86) {
    uVar54 = uVar54 - 6;
    uVar56 = 0x1f;
    if (uVar54 != 0) {
      for (; uVar54 >> uVar56 == 0; uVar56 = uVar56 - 1) {
      }
    }
    uVar56 = (uVar54 >> ((char)(uVar56 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar56 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar56 = 0x17;
    if (uVar54 < 0x846) {
      uVar56 = 0x1f;
      if (uVar54 - 0x46 != 0) {
        for (; uVar54 - 0x46 >> uVar56 == 0; uVar56 = uVar56 - 1) {
        }
      }
      uVar56 = (uVar56 ^ 0xffe0) + 0x2c;
    }
  }
  uVar6 = (ushort)uVar56;
  uVar49 = (uVar6 & 7) + ((ushort)uVar50 & 7) * 8;
  if ((((uVar66 & 0x3ff) == 0) && ((ushort)uVar50 < 8)) && (uVar6 < 0x10)) {
    if (7 < uVar6) {
      uVar49 = uVar49 + 0x40;
    }
  }
  else {
    iVar37 = ((uVar50 & 0xffff) >> 3) * 3 + ((uVar56 & 0xffff) >> 3);
    uVar49 = uVar49 + ((ushort)(0x520d40 >> ((char)iVar37 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar37 * 0x40 + 0x40;
  }
  local_128->cmd_prefix_ = uVar49;
  *num_literals = *num_literals + local_198;
  position = uVar45 + uVar58;
  uVar28 = sVar61;
  if (position < sVar61) {
    uVar28 = position;
  }
  uVar57 = uVar58 + 2;
  if (uVar60 < uVar45 >> 2) {
    uVar66 = position + uVar60 * -4;
    if (uVar66 < uVar57) {
      uVar66 = uVar57;
    }
    uVar57 = uVar66;
    if (uVar28 < uVar66) {
      uVar57 = uVar28;
    }
  }
  uVar66 = uVar58 + lVar62 + uVar45 * 2;
  local_128 = local_128 + 1;
  for (; uVar57 < uVar28; uVar57 = uVar57 + 1) {
    uVar29 = *(long *)(ringbuffer + (uVar57 & ringbuffer_mask)) * (hasher->privat)._H6.hash_mul_ >>
             0x31;
    uVar6 = *(ushort *)((long)puVar12 + uVar29 * 2);
    uVar50 = (hasher->privat)._H6.block_mask_;
    bVar30 = *(byte *)((long)&hasher->privat + 0x1c);
    *(ushort *)((long)puVar12 + uVar29 * 2) = uVar6 + 1;
    puVar13[(uVar29 << (bVar30 & 0x3f)) + (ulong)(uVar50 & uVar6)] = (uint32_t)uVar57;
  }
  local_198 = 0;
  goto LAB_01e2b56a;
code_r0x01e2c5eb:
  puVar32 = puVar32 + 1;
  puVar46 = puVar46 + 1;
  uVar51 = uVar51 - 8;
  lVar41 = lVar41 + -8;
  goto LAB_01e2c5da;
code_r0x01e2c44e:
  uVar26 = uVar26 - 8;
  lVar41 = lVar41 + 8;
  goto LAB_01e2c43a;
code_r0x01e2c27f:
  puVar46 = puVar46 + 1;
  puVar32 = puVar32 + 1;
  uVar69 = uVar69 - 8;
  lVar68 = lVar68 + -8;
  goto LAB_01e2c26d;
code_r0x01e2bedb:
  puVar32 = puVar32 + 1;
  puVar46 = puVar46 + 1;
  uVar58 = uVar58 - 8;
  lVar41 = lVar41 + -8;
  goto LAB_01e2beca;
code_r0x01e2b8e5:
  uVar40 = uVar40 - 8;
  lVar41 = lVar41 + 8;
  goto LAB_01e2b8d2;
code_r0x01e2b6fb:
  puVar46 = puVar46 + 1;
  puVar32 = puVar32 + 1;
  uVar67 = uVar67 - 8;
  lVar68 = lVar68 + -8;
  goto LAB_01e2b6e9;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}